

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizeDoubletonWithConstantOnRight
          (OptimizeInstructions *this,Binary *curr)

{
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *this_00;
  Expression *expr;
  size_t sVar1;
  Binary *this_01;
  undefined8 type;
  bool bVar2;
  BinaryOp BVar3;
  BinaryOp BVar4;
  Index IVar5;
  Index IVar6;
  uint uVar7;
  Const *pCVar8;
  _Head_base<0UL,_wasm::Tag_*,_false> _Var9;
  ulong extraout_RDX;
  Type TVar10;
  ulong uVar11;
  optional<wasm::Type> type_00;
  undefined1 local_328 [16];
  undefined1 local_318 [32];
  Type local_2f8;
  undefined1 local_1b8 [8];
  Builder builder;
  _Head_base<0UL,_wasm::Tag_*,_false> local_178;
  Binary *inner_5;
  undefined1 local_168 [16];
  _Head_base<0UL,_wasm::Tag_*,_false> local_158;
  undefined8 local_150;
  undefined1 *local_140;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_138;
  undefined1 local_120 [8];
  Binary *inner_1;
  pointer local_110;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_108;
  Expression *local_f8;
  Const *c1_5;
  undefined1 local_e8 [8];
  Binary *inner;
  Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
  *local_d8;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_d0;
  pointer local_c8;
  Index local_a4;
  undefined1 local_a0 [8];
  Const *c2_4;
  Const *c1_1;
  undefined8 local_88;
  undefined8 local_80;
  _Head_base<0UL,_wasm::Export_*,_false> local_70;
  Const *c2;
  _Head_base<0UL,_wasm::Tag_*,_false> local_60;
  Const *c1;
  pointer local_50;
  Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
  *local_48;
  BinaryOp local_34;
  
  pCVar8 = Expression::cast<wasm::Const>(curr->right);
  local_140 = local_1b8;
  local_1b8 = (undefined1  [8])0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  local_168._8_8_ = local_e8;
  this_00 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
             *)(local_168 + 8);
  local_150 = 0;
  local_318._0_8_ = &stack0xffffffffffffffa0;
  local_138 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)local_318;
  bVar2 = Match::Internal::
          Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)this_00,curr->left);
  if ((bVar2) &&
     ((BinaryOp)(((Name *)((long)local_e8 + 0x10))->super_IString).str._M_len == curr->op)) {
    TVar10.id = (((SpecificExpression<(wasm::Expression::Id)1> *)local_e8)->super_Expression).type.
                id;
    BVar4 = (BinaryOp)(((Name *)((long)local_e8 + 0x10))->super_IString).str._M_len;
    inner_5 = (Binary *)this;
    c1_5 = pCVar8;
    BVar3 = Abstract::getBinary(TVar10,And);
    if (BVar4 == BVar3) {
      Literal::and_((Literal *)local_318,
                    (Literal *)
                    &((local_60._M_head_impl)->super_Importable).super_Named.hasExplicitName,
                    &c1_5->value);
      Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
LAB_00ae2eca:
      Literal::~Literal((Literal *)local_318);
      return (Expression *)(_Head_base<0UL,_wasm::Tag_*,_false>)local_e8;
    }
    local_34 = BVar4;
    BVar4 = Abstract::getBinary(TVar10,Or);
    pCVar8 = c1_5;
    if (local_34 == BVar4) {
      Literal::or_((Literal *)local_318,(Literal *)((long)local_60._M_head_impl + 0x10),&c1_5->value
                  );
      Literal::operator=((Literal *)
                         &((local_60._M_head_impl)->super_Importable).super_Named.hasExplicitName,
                         (Literal *)local_318);
      goto LAB_00ae2eca;
    }
    BVar4 = Abstract::getBinary(TVar10,Xor);
    if (local_34 == BVar4) {
      Literal::xor_((Literal *)local_318,
                    (Literal *)
                    &((local_60._M_head_impl)->super_Importable).super_Named.hasExplicitName,
                    &pCVar8->value);
      Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
      goto LAB_00ae2eca;
    }
    BVar4 = Abstract::getBinary(TVar10,Mul);
    if (local_34 == BVar4) {
      Literal::mul((Literal *)local_318,(Literal *)((long)local_60._M_head_impl + 0x10),
                   &pCVar8->value);
      Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
      goto LAB_00ae2eca;
    }
    local_168._0_8_ = TVar10.id;
    if ((local_34 < EqInt64) &&
       (uVar11 = (ulong)local_34, (0xf800007c00U >> (uVar11 & 0x3f) & 1) != 0)) {
      local_a4 = Bits::getEffectiveShifts((Expression *)local_60._M_head_impl);
      IVar5 = Bits::getEffectiveShifts((Expression *)pCVar8);
      IVar5 = IVar5 + local_a4;
      IVar6 = Bits::getEffectiveShifts(IVar5,(Type)((Type *)((long)local_60._M_head_impl + 8))->id);
      type = local_168._0_8_;
      if (IVar5 == IVar6) {
        Literal::makeFromInt32
                  ((Literal *)local_318,IVar5,
                   (Type)((Type *)&((local_60._M_head_impl)->super_Importable).super_Named.name.
                                   super_IString.str._M_str)->id);
        Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
        goto LAB_00ae2eca;
      }
      if ((local_34 < EqInt64) && ((0xc000006000U >> (uVar11 & 0x3f) & 1) != 0)) {
        Literal::makeFromInt32
                  ((Literal *)local_318,IVar6,
                   (Type)((Type *)&((local_60._M_head_impl)->super_Importable).super_Named.name.
                                   super_IString.str._M_str)->id);
        Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
        goto LAB_00ae2eca;
      }
      BVar4 = Abstract::getBinary((Type)local_168._0_8_,Shl);
      if ((local_34 == BVar4) ||
         (BVar3 = Abstract::getBinary((Type)type,ShrU), BVar4 = local_34, local_34 == BVar3)) {
        this_01 = inner_5;
        expr = (Expression *)(((Name *)((long)local_e8 + 0x10))->super_IString).str._M_str;
        Literal::makeZero((Literal *)local_318,
                          (Type)(((SpecificExpression<(wasm::Expression::Id)1> *)
                                 &(local_60._M_head_impl)->super_Importable)->super_Expression).type
                                .id);
        Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
        Literal::~Literal((Literal *)local_318);
        effects((EffectAnalyzer *)local_318,(OptimizeInstructions *)this_01,expr);
        bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)local_318);
        EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)local_318);
        if (!bVar2) {
          return (Expression *)local_60._M_head_impl;
        }
        local_1b8 = *(undefined1 (*) [8])&this_01[7].op;
        local_168._8_8_ = Builder::makeDrop((Builder *)local_1b8,expr);
        local_158._M_head_impl = local_60._M_head_impl;
        local_318._8_8_ = (char *)0x2;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._8_8_ = 0;
        type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::Type>._M_payload =
             (_Storage<wasm::Type,_true>)extraout_RDX;
        local_318._0_8_ = this_00;
        _Var9._M_head_impl =
             (Tag *)Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>
                              ((Builder *)local_1b8,
                               (initializer_list<wasm::Expression_*> *)local_318,type_00);
        return (Expression *)_Var9._M_head_impl;
      }
      BVar3 = Abstract::getBinary((Type)type,ShrS);
      if (BVar4 == BVar3) {
        uVar7 = wasm::Type::getByteSize
                          ((Type *)&((local_60._M_head_impl)->super_Importable).super_Named.name.
                                    super_IString.str._M_str);
        Literal::makeFromInt32
                  ((Literal *)local_318,uVar7 * 8 + -1,
                   (Type)((Type *)((long)local_60._M_head_impl + 8))->id);
        Literal::operator=((Literal *)((long)local_60._M_head_impl + 0x10),(Literal *)local_318);
        goto LAB_00ae2eca;
      }
    }
  }
  local_60._M_head_impl = (Tag *)0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  local_318._0_8_ = &c2_4;
  inner._0_4_ = 10;
  local_150 = 0;
  local_140 = (undefined1 *)0x0;
  local_168._8_8_ = &stack0xffffffffffffff90;
  local_1b8 = (undefined1  [8])0x0;
  builder.wasm._0_4_ = 5;
  local_e8 = (undefined1  [8])local_120;
  local_d8 = (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&stack0xffffffffffffffa0;
  local_d0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              *)local_318;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_1b8,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar2) {
    BVar4 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)1> *)local_120)->
                                      super_Expression).type.id,Mul);
    *(BinaryOp *)&(((Name *)((long)local_120 + 0x10))->super_IString).str._M_len = BVar4;
    Literal::shl((Literal *)local_318,(Literal *)&(local_70._M_head_impl)->kind,&c2_4->value);
    Literal::operator=(&c2_4->value,(Literal *)local_318);
LAB_00ae31df:
    Literal::~Literal((Literal *)local_318);
    return (Expression *)local_120;
  }
  local_60._M_head_impl = (Tag *)0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  local_318._0_8_ = &c2_4;
  inner._0_4_ = 5;
  local_150 = 0;
  local_d0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              *)local_318;
  local_140 = (undefined1 *)0x0;
  local_1b8 = (undefined1  [8])0x0;
  local_168._8_8_ = &stack0xffffffffffffff90;
  builder.wasm._0_4_ = 10;
  local_e8 = (undefined1  [8])local_120;
  local_d8 = (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&stack0xffffffffffffffa0;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_1b8,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar2) {
    Literal::shl((Literal *)local_318,&c2_4->value,(Literal *)&(local_70._M_head_impl)->kind);
    Literal::operator=(&c2_4->value,(Literal *)local_318);
    goto LAB_00ae31df;
  }
  local_60._M_head_impl = (Tag *)0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  local_150 = 0;
  local_140 = (undefined1 *)0x0;
  local_e8 = (undefined1  [8])0x0;
  local_168._8_8_ = &stack0xffffffffffffff90;
  inner._0_4_ = 10;
  local_318._0_8_ = (element_type *)&c2_4;
  local_1b8 = (undefined1  [8])local_120;
  local_d8 = (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)local_1b8;
  local_d0 = this_00;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_e8,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if ((bVar2) &&
     ((sVar1 = (((Name *)((long)local_120 + 0x10))->super_IString).str._M_len,
      BVar4 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)1> *)local_120)
                                        ->super_Expression).type.id,ShrS), (BinaryOp)sVar1 == BVar4
      || (sVar1 = (((Name *)((long)local_120 + 0x10))->super_IString).str._M_len,
         BVar4 = Abstract::getBinary((Type)(((SpecificExpression<(wasm::Expression::Id)1> *)
                                            local_120)->super_Expression).type.id,ShrU),
         (BinaryOp)sVar1 == BVar4)))) {
    IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
    IVar6 = Bits::getEffectiveShifts((Expression *)local_70._M_head_impl);
    if (IVar5 == IVar6) {
      TVar10.id = (c2_4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                  id;
      if (TVar10.id == 2) {
        IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
        Literal::makeFromInt32((Literal *)local_318,-1 << ((byte)IVar5 & 0x1f),(Type)0x2);
        Literal::operator=(&c2_4->value,(Literal *)local_318);
      }
      else {
        IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
        Literal::makeFromInt64((Literal *)local_318,-1L << ((byte)IVar5 & 0x3f),(Type)0x3);
        Literal::operator=(&c2_4->value,(Literal *)local_318);
      }
      goto LAB_00ae3639;
    }
  }
  local_60._M_head_impl = (Tag *)0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  inner._0_4_ = 10;
  local_d8 = (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
              *)&stack0xffffffffffffffa0;
  local_150 = 0;
  local_140 = (undefined1 *)0x0;
  local_1b8 = (undefined1  [8])0x0;
  local_168._8_8_ = &stack0xffffffffffffff90;
  builder.wasm._0_4_ = 0xb;
  local_318._0_8_ = (element_type *)&c2_4;
  local_e8 = (undefined1  [8])local_120;
  local_d0 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
              *)local_318;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_1b8,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (bVar2) {
    IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
    IVar6 = Bits::getEffectiveShifts((Expression *)local_70._M_head_impl);
    if (IVar5 == IVar6) {
      TVar10.id = (c2_4->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.
                  id;
      if (TVar10.id == 2) {
        IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
        Literal::makeFromInt32((Literal *)local_318,0xffffffff >> ((byte)IVar5 & 0x1f),(Type)0x2);
        Literal::operator=(&c2_4->value,(Literal *)local_318);
      }
      else {
        IVar5 = Bits::getEffectiveShifts((Expression *)c2_4);
        Literal::makeFromInt64
                  ((Literal *)local_318,0xffffffffffffffff >> ((byte)IVar5 & 0x3f),(Type)0x3);
        Literal::operator=(&c2_4->value,(Literal *)local_318);
      }
LAB_00ae3639:
      Literal::~Literal((Literal *)local_318);
      BVar4 = Abstract::getBinary(TVar10,And);
      *(BinaryOp *)&(((Importable *)local_120)->super_Named).hasExplicitName = BVar4;
      return (Expression *)local_120;
    }
  }
  local_110 = (pointer)&stack0xffffffffffffff90;
  local_70._M_head_impl = (Export *)0x0;
  local_318._16_8_ = 0;
  local_2f8.id = 0;
  inner_1._0_4_ = 0xe;
  local_150 = 0;
  local_140 = (undefined1 *)0x0;
  local_1b8 = (undefined1  [8])0x0;
  builder.wasm._0_4_ = 0xd;
  local_318._0_8_ = (Module *)&stack0xffffffffffffff08;
  local_168._8_8_ = (Module *)local_a0;
  local_120 = (undefined1  [8])&local_178;
  local_108 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
               *)local_318;
  bVar2 = Match::Internal::
          Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
          ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                     *)local_1b8,
                    (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                     )curr);
  if (!bVar2) {
    local_88 = local_328;
    local_328._0_8_ = 0;
    c1_1._0_4_ = 0xd;
    local_d8 = (Matcher<wasm::Binary_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::BinaryOp>_>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)0x0;
    local_c8 = (pointer)0x0;
    local_60._M_head_impl = (Tag *)0x0;
    c1._0_4_ = 0xe;
    local_50 = (pointer)&c2_4;
    local_48 = (Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>
                *)local_e8;
    local_1b8 = (undefined1  [8])&stack0xffffffffffffff08;
    local_e8 = (undefined1  [8])local_a0;
    c2_4 = (Const *)&local_178;
    local_80 = (Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                *)local_1b8;
    bVar2 = Match::Internal::
            Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
            ::matches((Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<wasm::Expression_*>_>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>_&,_wasm::Match::Internal::Matcher<wasm::Const_*,_wasm::Match::Internal::Matcher<wasm::Match::Internal::LitKind<wasm::Match::Internal::IntLK>,_wasm::Match::Internal::Matcher<wasm::Match::Internal::AnyKind<long>_>_>_>_&>
                       *)&stack0xffffffffffffffa0,
                      (candidate_t<wasm::Match::Internal::BinaryOpKind<wasm::Match::Internal::AbstractBinaryOpK>_>
                       )curr);
    if (!bVar2) {
      return (Expression *)(Block *)0x0;
    }
  }
  IVar5 = Bits::getEffectiveShifts(local_f8);
  IVar6 = Bits::getEffectiveShifts((Expression *)local_a0);
  IVar5 = Bits::getEffectiveShifts(IVar5 - IVar6,(Type)((Type *)((long)local_a0 + 8))->id);
  Literal::makeFromInt32((Literal *)local_318,IVar5,(Type)((Type *)((long)local_a0 + 8))->id);
  Literal::operator=((Literal *)(local_f8 + 1),(Literal *)local_318);
  Literal::~Literal((Literal *)local_318);
  return (Expression *)local_178._M_head_impl;
}

Assistant:

Expression* optimizeDoubletonWithConstantOnRight(Binary* curr) {
    using namespace Match;
    using namespace Abstract;
    {
      Binary* inner;
      Const *c1, *c2 = curr->right->cast<Const>();
      if (matches(curr->left, binary(&inner, any(), ival(&c1))) &&
          inner->op == curr->op) {
        Type type = inner->type;
        BinaryOp op = inner->op;
        // (x & C1) & C2   =>   x & (C1 & C2)
        if (op == getBinary(type, And)) {
          c1->value = c1->value.and_(c2->value);
          return inner;
        }
        // (x | C1) | C2   =>   x | (C1 | C2)
        if (op == getBinary(type, Or)) {
          c1->value = c1->value.or_(c2->value);
          return inner;
        }
        // (x ^ C1) ^ C2   =>   x ^ (C1 ^ C2)
        if (op == getBinary(type, Xor)) {
          c1->value = c1->value.xor_(c2->value);
          return inner;
        }
        // (x * C1) * C2   =>   x * (C1 * C2)
        if (op == getBinary(type, Mul)) {
          c1->value = c1->value.mul(c2->value);
          return inner;
        }
        // TODO:
        // handle signed / unsigned divisions. They are more complex

        // (x <<>> C1) <<>> C2   =>   x <<>> (C1 + C2)
        if (hasAnyShift(op)) {
          // shifts only use an effective amount from the constant, so
          // adding must be done carefully
          auto total =
            Bits::getEffectiveShifts(c1) + Bits::getEffectiveShifts(c2);
          auto effectiveTotal = Bits::getEffectiveShifts(total, c1->type);
          if (total == effectiveTotal) {
            // no overflow, we can do this
            c1->value = Literal::makeFromInt32(total, c1->type);
            return inner;
          } else {
            // overflow. Handle different scenarious
            if (hasAnyRotateShift(op)) {
              // overflow always accepted in rotation shifts
              c1->value = Literal::makeFromInt32(effectiveTotal, c1->type);
              return inner;
            }
            // handle overflows for general shifts
            //   x << C1 << C2    =>   0 or { drop(x), 0 }
            //   x >>> C1 >>> C2  =>   0 or { drop(x), 0 }
            // iff `C1 + C2` -> overflows
            if ((op == getBinary(type, Shl) || op == getBinary(type, ShrU))) {
              auto* x = inner->left;
              c1->value = Literal::makeZero(c1->type);
              if (!effects(x).hasSideEffects()) {
                //  =>  0
                return c1;
              } else {
                //  =>  { drop(x), 0 }
                Builder builder(*getModule());
                return builder.makeBlock({builder.makeDrop(x), c1});
              }
            }
            //   i32(x) >> C1 >> C2   =>   x >> 31
            //   i64(x) >> C1 >> C2   =>   x >> 63
            // iff `C1 + C2` -> overflows
            if (op == getBinary(type, ShrS)) {
              c1->value = Literal::makeFromInt32(c1->type.getByteSize() * 8 - 1,
                                                 c1->type);
              return inner;
            }
          }
        }
      }
    }
    {
      // (x << C1) * C2   =>   x * (C2 << C1)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Mul, binary(&inner, Shl, any(), ival(&c1)), ival(&c2)))) {
        inner->op = getBinary(inner->type, Mul);
        c1->value = c2->value.shl(c1->value);
        return inner;
      }
    }
    {
      // (x * C1) << C2   =>   x * (C1 << C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(Shl, binary(&inner, Mul, any(), ival(&c1)), ival(&c2)))) {
        c1->value = c1->value.shl(c2->value);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x >> C)  << C   =>   x & -(1 << C)
      // (x >>> C) << C   =>   x & -(1 << C)
      Binary* inner;
      Const *c1, *c2;
      if (matches(curr,
                  binary(Shl, binary(&inner, any(), ival(&c1)), ival(&c2))) &&
          (inner->op == getBinary(inner->type, ShrS) ||
           inner->op == getBinary(inner->type, ShrU)) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -(1U << Bits::getEffectiveShifts(c1)), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -(1ULL << Bits::getEffectiveShifts(c1)), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add cancelation for some large constants when shrinkLevel > 0
      // in FinalOptimizer.

      // (x << C) >>> C   =>   x & (-1 >>> C)
      // (x << C) >> C    =>   skip
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(ShrU, binary(&inner, Shl, any(), ival(&c1)), ival(&c2))) &&
          Bits::getEffectiveShifts(c1) == Bits::getEffectiveShifts(c2)) {
        auto type = c1->type;
        if (type == Type::i32) {
          c1->value = Literal::makeFromInt32(
            -1U >> Bits::getEffectiveShifts(c1), Type::i32);
        } else {
          c1->value = Literal::makeFromInt64(
            -1ULL >> Bits::getEffectiveShifts(c1), Type::i64);
        }
        inner->op = getBinary(type, And);
        return inner;
      }
    }
    {
      // TODO: Add canonicalization rotr to rotl and remove these rules.
      // rotl(rotr(x, C1), C2)   =>   rotr(x, C1 - C2)
      // rotr(rotl(x, C1), C2)   =>   rotl(x, C1 - C2)
      Binary* inner;
      Const *c1, *c2;
      if (matches(
            curr,
            binary(RotL, binary(&inner, RotR, any(), ival(&c1)), ival(&c2))) ||
          matches(
            curr,
            binary(RotR, binary(&inner, RotL, any(), ival(&c1)), ival(&c2)))) {
        auto diff = Bits::getEffectiveShifts(c1) - Bits::getEffectiveShifts(c2);
        c1->value = Literal::makeFromInt32(
          Bits::getEffectiveShifts(diff, c2->type), c2->type);
        return inner;
      }
    }
    return nullptr;
  }